

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

void __thiscall
QConfFileSettingsPrivate::QConfFileSettingsPrivate
          (QConfFileSettingsPrivate *this,QString *fileName,Format format)

{
  long in_FS_OFFSET;
  QConfFile *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)this,QObjectPrivateVersion);
  (this->super_QSettingsPrivate).format = format;
  *(undefined8 *)&(this->super_QSettingsPrivate).scope = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).organizationName.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).organizationName.d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).organizationName.d.size + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).applicationName.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).applicationName.d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).applicationName.d.size + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_QSettingsPrivate).groupStack.super_QList<QSettingsGroup>.d.d + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_QSettingsPrivate).groupStack.super_QList<QSettingsGroup>.d.ptr + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_QSettingsPrivate).groupStack.super_QList<QSettingsGroup>.d.size + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).groupPrefix.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QSettingsPrivate).groupPrefix.d.ptr + 4) = 0;
  *(undefined4 *)((long)&(this->super_QSettingsPrivate).groupPrefix.d.size + 4) = 0;
  (this->super_QSettingsPrivate).fallbacks = true;
  (this->super_QSettingsPrivate).pendingChanges = false;
  (this->super_QSettingsPrivate).atomicSyncOnly = true;
  (this->super_QSettingsPrivate).status = NoError;
  (this->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QConfFileSettingsPrivate_006b0f48;
  (this->confFiles).d.d = (Data *)0x0;
  (this->confFiles).d.ptr = (QConfFile **)0x0;
  (this->confFiles).d.size = 0;
  (this->extension).d.d = (Data *)0x0;
  (this->extension).d.ptr = (char16_t *)0x0;
  (this->extension).d.size = 0;
  this->nextPosition = 0x40000000;
  initFormat(this);
  local_38 = QConfFile::fromName(fileName,true);
  QtPrivate::QPodArrayOps<QConfFile*>::emplace<QConfFile*&>
            ((QPodArrayOps<QConfFile*> *)&this->confFiles,(this->confFiles).d.size,&local_38);
  QList<QConfFile_*>::end(&this->confFiles);
  (*(this->super_QSettingsPrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData[0xd])
            (this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QConfFileSettingsPrivate::QConfFileSettingsPrivate(const QString &fileName,
                                                   QSettings::Format format)
    : QSettingsPrivate(format),
      nextPosition(0x40000000) // big positive number
{
    initFormat();

    confFiles.append(QConfFile::fromName(fileName, true));

    initAccess();
}